

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O0

char * __thiscall
CVmImagePool::vmpbs_alloc_and_load_page
          (CVmImagePool *this,pool_ofs_t ofs,size_t param_3,size_t load_size)

{
  int iVar1;
  CVmImagePool_pg *pCVar2;
  undefined4 extraout_var;
  CVmImagePool *in_RCX;
  CVmImagePool *in_RDI;
  CVmImagePool_pg *info;
  pool_ofs_t in_stack_ffffffffffffffcc;
  
  pCVar2 = get_page_info_ofs(in_RDI,in_stack_ffffffffffffffcc);
  seek_page_ofs(in_RCX,(pool_ofs_t)((ulong)pCVar2 >> 0x20));
  iVar1 = (*in_RDI->fp_->_vptr_CVmImageFile[4])(in_RDI->fp_,in_RCX,(ulong)pCVar2->xor_mask,in_RCX);
  return (char *)CONCAT44(extraout_var,iVar1);
}

Assistant:

const char *CVmImagePool::
   vmpbs_alloc_and_load_page(pool_ofs_t ofs, size_t /*page_size*/,
                             size_t load_size)
{
    CVmImagePool_pg *info;
    
    /* get the page information */
    info = get_page_info_ofs(ofs);
    
    /* seek to the correct location in the image file */
    seek_page_ofs(ofs);

    /* ask the underlying file to load the data */
    return fp_->alloc_and_read(load_size, info->xor_mask, load_size);
}